

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Padding_x86_fma::forward_int8
          (Padding_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  size_t sVar5;
  _func_int *p_Var6;
  void *pvVar7;
  size_t sVar8;
  int *piVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  Mat *pMVar19;
  long lVar20;
  Mat *pMVar21;
  int iVar22;
  undefined8 *puVar23;
  long lVar24;
  int iVar25;
  uint uVar26;
  undefined8 *puVar27;
  long lVar28;
  undefined8 *puVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 in_ZMM6 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [32];
  undefined1 in_ZMM7 [64];
  _func_int **local_160;
  Mat m;
  Option opt_pack1;
  
  auVar38 = in_ZMM6._0_16_;
  auVar39 = in_ZMM7._0_16_;
  uVar18 = bottom_blob->c;
  m.elemsize = bottom_blob->elemsize;
  m.elempack = bottom_blob->elempack;
  m.dims = bottom_blob->dims;
  m.w = bottom_blob->w;
  m.h = bottom_blob->h;
  iVar11 = bottom_blob->d;
  m.d = bottom_blob->d;
  m.c = bottom_blob->c;
  if (m.elempack == 8) {
    switch(m.dims) {
    case 1:
      p_Var6 = this->_vptr_Padding_x86_fma[-3];
      uVar18 = *(uint *)(&this->field_0xd8 + (long)p_Var6) + m.w * 8 +
               *(int *)(&this->field_0xdc + (long)p_Var6);
      bVar35 = (uVar18 & 7) == 0;
      if ((bVar35 && (*(uint *)(&this->field_0xd8 + (long)p_Var6) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
        Mat::create(top_blob,(int)uVar18 >> 3,(m.elemsize >> 3) << bVar35 * '\x03',8,
                    opt->blob_allocator);
        if ((Mat *)top_blob->data == (Mat *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          p_Var6 = this->_vptr_Padding_x86_fma[-3];
          uVar34 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var6);
          iVar11 = *(int *)(&this->field_0xd8 + (long)p_Var6);
          iVar22 = iVar11 + 7;
          if (-1 < iVar11) {
            iVar22 = iVar11;
          }
          iVar11 = *(int *)(&this->field_0xdc + (long)p_Var6);
          iVar15 = iVar11 + 7;
          if (-1 < iVar11) {
            iVar15 = iVar11;
          }
          padding_constant_pack8_int8_sse
                    ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0,
                     iVar22 >> 3,iVar15 >> 3,
                     uVar34 << 0x38 | uVar34 << 0x30 | uVar34 << 0x28 |
                     uVar34 << 0x20 | uVar34 << 0x18 | uVar34 << 0x10 | uVar34 << 8 | uVar34);
          return 0;
        }
        return -100;
      }
      break;
    case 2:
      p_Var6 = this->_vptr_Padding_x86_fma[-3];
      uVar18 = *(uint *)(&this->field_0xd0 + (long)p_Var6) + m.h * 8 +
               *(int *)(&this->field_0xd4 + (long)p_Var6);
      bVar35 = (uVar18 & 7) == 0;
      if ((bVar35 && (*(uint *)(&this->field_0xd0 + (long)p_Var6) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
        Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var6) +
                             *(int *)(&this->field_0xdc + (long)p_Var6),(int)uVar18 >> 3,
                    (m.elemsize >> 3) << bVar35 * '\x03',8,opt->blob_allocator);
        if ((Mat *)top_blob->data == (Mat *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          p_Var6 = this->_vptr_Padding_x86_fma[-3];
          uVar34 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var6);
          iVar11 = *(int *)(&this->field_0xd0 + (long)p_Var6);
          iVar22 = *(int *)(&this->field_0xd4 + (long)p_Var6);
          iVar15 = iVar11 + 7;
          if (-1 < iVar11) {
            iVar15 = iVar11;
          }
          iVar11 = iVar22 + 7;
          if (-1 < iVar22) {
            iVar11 = iVar22;
          }
          padding_constant_pack8_int8_sse
                    ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                     iVar15 >> 3,iVar11 >> 3,*(int *)(&this->field_0xd8 + (long)p_Var6),
                     *(int *)(&this->field_0xdc + (long)p_Var6),
                     uVar34 << 0x38 | uVar34 << 0x30 | uVar34 << 0x28 |
                     uVar34 << 0x20 | uVar34 << 0x18 | uVar34 << 0x10 | uVar34 << 8 | uVar34);
          return 0;
        }
        return -100;
      }
      break;
    case 3:
      p_Var6 = this->_vptr_Padding_x86_fma[-3];
      uVar16 = *(uint *)(&this->field_0xe8 + (long)p_Var6) + uVar18 * 8 +
               *(int *)(&this->field_0xec + (long)p_Var6);
      bVar35 = (uVar16 & 7) == 0;
      if (bVar35 && (*(uint *)(&this->field_0xe8 + (long)p_Var6) & 7) == 0) {
        if ((uVar16 == uVar18 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
          uVar16 = (int)uVar16 >> 3;
          Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var6) +
                               *(int *)(&this->field_0xdc + (long)p_Var6),
                      m.h + *(int *)(&this->field_0xd0 + (long)p_Var6) +
                      *(int *)(&this->field_0xd4 + (long)p_Var6),uVar16,
                      (m.elemsize >> 3) << bVar35 * '\x03',8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            local_160 = this->_vptr_Padding_x86_fma;
            iVar11 = *(int *)(&this->field_0xe8 + (long)local_160[-3]);
            iVar22 = iVar11 + 7;
            if (-1 < iVar11) {
              iVar22 = iVar11;
            }
            if ((int)uVar16 < 1) {
              return 0;
            }
            uVar34 = 0;
            auVar55 = ZEXT3264(_DAT_00515cc0);
            auVar38 = vpcmpeqd_avx(auVar39,auVar39);
            auVar56 = ZEXT1664(auVar38);
            uVar26 = -(iVar22 >> 3);
            do {
              pvVar7 = top_blob->data;
              uVar12 = top_blob->elemsize;
              p_Var6 = local_160[-3];
              uVar33 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var6);
              sVar8 = top_blob->cstep;
              uVar33 = uVar33 << 0x38 | uVar33 << 0x30 | uVar33 << 0x28 |
                       uVar33 << 0x20 | uVar33 << 0x18 | uVar33 << 0x10 | uVar33 << 8 | uVar33;
              uVar10 = -(iVar22 >> 3) + (int)uVar34;
              auVar38 = auVar56._0_16_;
              if ((int)uVar10 < 0 || (int)uVar18 <= (int)uVar10) {
                lVar20 = (long)top_blob->h * (long)top_blob->w;
                iVar11 = (int)((lVar20 * uVar12 + 0xf & 0xfffffffffffffff0) / uVar12);
                if (top_blob->dims == 4) {
                  iVar11 = (int)lVar20;
                }
                uVar10 = iVar11 * top_blob->d;
                if (0 < (int)uVar10) {
                  auVar36._8_8_ = 0;
                  auVar36._0_8_ = (ulong)uVar10 - 1;
                  auVar39 = vpshufd_avx(auVar36,0x44);
                  auVar37._8_8_ = 0;
                  auVar37._0_8_ = uVar33;
                  auVar40 = vpshufd_avx(auVar37,0x44);
                  auVar41._16_16_ = auVar40;
                  auVar41._0_16_ = auVar40;
                  auVar42._0_8_ = auVar39._0_8_ ^ 0x8000000000000000;
                  auVar42._8_4_ = auVar39._8_4_;
                  auVar42._12_4_ = auVar39._12_4_ ^ 0x80000000;
                  auVar44._0_8_ = auVar39._0_8_ ^ 0x8000000000000000;
                  auVar44._8_4_ = auVar42._8_4_;
                  auVar44._12_4_ = auVar39._12_4_ ^ 0x80000000;
                  uVar33 = 0;
                  do {
                    auVar49._8_8_ = 0;
                    auVar49._0_8_ = uVar33;
                    auVar39 = vpshufd_avx(auVar49,0x44);
                    auVar52._16_16_ = auVar39;
                    auVar52._0_16_ = auVar39;
                    auVar57 = vorps_avx(auVar52,auVar55._0_32_);
                    auVar54._0_8_ = auVar57._16_8_ ^ 0x8000000000000000;
                    auVar54._8_4_ = auVar57._24_4_;
                    auVar54._12_4_ = auVar57._28_4_ ^ 0x80000000;
                    auVar39 = vpcmpgtq_avx(auVar54,auVar42);
                    auVar50._0_8_ = auVar57._0_8_ ^ 0x8000000000000000;
                    auVar50._8_4_ = auVar57._8_4_;
                    auVar50._12_4_ = auVar57._12_4_ ^ 0x80000000;
                    auVar40 = vpcmpgtq_avx(auVar50,auVar44);
                    auVar53._16_16_ = auVar39 ^ auVar38;
                    auVar53._0_16_ = auVar40 ^ auVar38;
                    auVar57 = vmaskmovpd_avx(auVar53,auVar41);
                    *(undefined1 (*) [32])((long)pvVar7 + uVar33 * 8 + sVar8 * uVar12 * uVar34) =
                         auVar57;
                    uVar33 = uVar33 + 4;
                  } while ((uVar10 + 3 & 0xfffffffc) != uVar33);
                }
              }
              else {
                iVar11 = bottom_blob->w;
                lVar20 = (long)iVar11;
                iVar15 = bottom_blob->h;
                pvVar4 = bottom_blob->data;
                uVar17 = bottom_blob->elemsize;
                sVar5 = bottom_blob->cstep;
                puVar29 = (undefined8 *)(uVar10 * sVar5 * uVar17 + (long)pvVar4);
                m.elempack = bottom_blob->elempack;
                m.allocator = bottom_blob->allocator;
                m.refcount = (int *)0x0;
                m.c = bottom_blob->d;
                m.d = 1;
                m.dims = bottom_blob->dims + -1;
                m.cstep = (uVar17 * iVar15 * lVar20 + 0xf & 0xfffffffffffffff0) / uVar17;
                if (bottom_blob->dims == 4) {
                  m.cstep = iVar15 * lVar20;
                }
                pMVar19 = (Mat *)((long)pvVar7 + sVar8 * uVar34 * uVar12);
                if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0) {
                  m.data = puVar29;
                  m.elemsize = uVar17;
                  m.w = iVar11;
                  m.h = iVar15;
                  padding_constant_pack8_int8_sse
                            ((ncnn *)&m,pMVar19,(Mat *)(long)top_blob->w,
                             *(int *)(&this->field_0xd0 + (long)p_Var6),
                             *(int *)(&this->field_0xd4 + (long)p_Var6),
                             *(int *)(&this->field_0xd8 + (long)p_Var6),
                             *(int *)(&this->field_0xdc + (long)p_Var6),uVar33);
                  auVar38 = vpcmpeqd_avx(auVar38,auVar38);
                  auVar56 = ZEXT1664(auVar38);
                  auVar55 = ZEXT3264(_DAT_00515cc0);
                  local_160 = this->_vptr_Padding_x86_fma;
                }
                p_Var6 = local_160[-3];
                if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 1) {
                  iVar13 = *(int *)(&this->field_0xd0 + (long)p_Var6);
                  iVar1 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                  iVar14 = *(int *)(&this->field_0xd8 + (long)p_Var6);
                  iVar2 = *(int *)(&this->field_0xdc + (long)p_Var6);
                  pMVar21 = pMVar19;
                  if (0 < iVar13) {
                    lVar24 = sVar5 * uVar17 * (ulong)uVar26;
                    iVar25 = 0;
                    do {
                      if (0 < iVar14) {
                        pvVar7 = (void *)*puVar29;
                        iVar30 = iVar14;
                        do {
                          pMVar21->data = pvVar7;
                          pMVar21 = (Mat *)&pMVar21->refcount;
                          iVar30 = iVar30 + -1;
                        } while (iVar30 != 0);
                      }
                      puVar23 = puVar29;
                      if (0 < iVar11) {
                        lVar28 = 0;
                        lVar31 = 0;
                        do {
                          (&pMVar21->data)[lVar31] = *(void **)((long)pvVar4 + lVar31 * 8 + lVar24);
                          lVar31 = lVar31 + 1;
                          lVar28 = lVar28 + -8;
                        } while (iVar11 != (int)lVar31);
                        pMVar21 = (Mat *)((long)pMVar21 - lVar28);
                        puVar23 = (undefined8 *)((long)pvVar4 + (lVar24 - lVar28));
                      }
                      if (0 < iVar2) {
                        pvVar7 = (void *)puVar23[-1];
                        iVar30 = iVar2;
                        do {
                          pMVar21->data = pvVar7;
                          pMVar21 = (Mat *)&pMVar21->refcount;
                          iVar30 = iVar30 + -1;
                        } while (iVar30 != 0);
                      }
                      iVar25 = iVar25 + 1;
                    } while (iVar25 != iVar13);
                  }
                  puVar23 = puVar29;
                  if (0 < iVar15) {
                    iVar13 = 0;
                    do {
                      if (0 < iVar14) {
                        pvVar7 = (void *)*puVar23;
                        iVar25 = iVar14;
                        do {
                          pMVar21->data = pvVar7;
                          pMVar21 = (Mat *)&pMVar21->refcount;
                          iVar25 = iVar25 + -1;
                        } while (iVar25 != 0);
                      }
                      if (0 < iVar11) {
                        lVar24 = 0;
                        lVar28 = 0;
                        do {
                          (&pMVar21->data)[lVar28] = (void *)puVar23[lVar28];
                          lVar28 = lVar28 + 1;
                          lVar24 = lVar24 + -8;
                        } while (iVar11 != (int)lVar28);
                        pMVar21 = (Mat *)((long)pMVar21 - lVar24);
                        puVar23 = (undefined8 *)((long)puVar23 - lVar24);
                      }
                      if (0 < iVar2) {
                        pvVar7 = (void *)puVar23[-1];
                        iVar25 = iVar2;
                        do {
                          pMVar21->data = pvVar7;
                          pMVar21 = (Mat *)&pMVar21->refcount;
                          iVar25 = iVar25 + -1;
                        } while (iVar25 != 0);
                      }
                      iVar13 = iVar13 + 1;
                    } while (iVar13 != iVar15);
                  }
                  if (0 < iVar1) {
                    puVar23 = puVar23 + -lVar20;
                    iVar13 = 0;
                    do {
                      if (0 < iVar14) {
                        pvVar7 = (void *)*puVar23;
                        iVar25 = iVar14;
                        do {
                          pMVar21->data = pvVar7;
                          pMVar21 = (Mat *)&pMVar21->refcount;
                          iVar25 = iVar25 + -1;
                        } while (iVar25 != 0);
                      }
                      puVar27 = puVar23;
                      if (0 < iVar11) {
                        lVar24 = 0;
                        lVar28 = 0;
                        do {
                          (&pMVar21->data)[lVar28] = (void *)puVar23[lVar28];
                          lVar28 = lVar28 + 1;
                          lVar24 = lVar24 + -8;
                        } while (iVar11 != (int)lVar28);
                        pMVar21 = (Mat *)((long)pMVar21 - lVar24);
                        puVar27 = (undefined8 *)((long)puVar23 - lVar24);
                      }
                      if (0 < iVar2) {
                        pvVar7 = (void *)puVar27[-1];
                        iVar25 = iVar2;
                        do {
                          pMVar21->data = pvVar7;
                          pMVar21 = (Mat *)&pMVar21->refcount;
                          iVar25 = iVar25 + -1;
                        } while (iVar25 != 0);
                      }
                      iVar13 = iVar13 + 1;
                    } while (iVar13 != iVar1);
                  }
                }
                p_Var6 = local_160[-3];
                if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 2) {
                  iVar13 = *(int *)(&this->field_0xd0 + (long)p_Var6);
                  iVar1 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                  uVar10 = *(uint *)(&this->field_0xd8 + (long)p_Var6);
                  lVar28 = (long)(int)uVar10;
                  uVar12 = (ulong)uVar10;
                  uVar3 = *(uint *)(&this->field_0xdc + (long)p_Var6);
                  uVar33 = (ulong)uVar3;
                  lVar24 = (long)(iVar13 * iVar11);
                  if (iVar13 < 1) {
                    puVar29 = puVar29 + lVar24;
                  }
                  else {
                    lVar31 = sVar5 * uVar17 * (ulong)uVar26;
                    lVar32 = lVar31 + lVar28 * 8 + lVar24 * 8 + (long)pvVar4;
                    puVar29 = (undefined8 *)(lVar31 + lVar24 * 8 + (long)pvVar4);
                    iVar14 = 0;
                    do {
                      if (0 < (int)uVar10) {
                        lVar24 = 0;
                        do {
                          pMVar19->data = *(void **)(lVar32 + lVar24 * 8);
                          pMVar19 = (Mat *)&pMVar19->refcount;
                          lVar24 = lVar24 + -1;
                        } while (-lVar24 != uVar12);
                      }
                      puVar23 = puVar29;
                      if (0 < iVar11) {
                        lVar31 = 0;
                        lVar24 = 0;
                        do {
                          (&pMVar19->data)[lVar24] = (void *)puVar29[lVar24];
                          lVar24 = lVar24 + 1;
                          lVar31 = lVar31 + -8;
                        } while (iVar11 != (int)lVar24);
                        pMVar19 = (Mat *)((long)pMVar19 - lVar31);
                        puVar23 = (undefined8 *)((long)puVar29 - lVar31);
                      }
                      if (0 < (int)uVar3) {
                        lVar24 = 0;
                        do {
                          pMVar19->data = (void *)puVar23[lVar24 + -2];
                          pMVar19 = (Mat *)&pMVar19->refcount;
                          lVar24 = lVar24 + -1;
                        } while (-lVar24 != uVar33);
                      }
                      puVar29 = puVar29 + -lVar20;
                      iVar14 = iVar14 + 1;
                      lVar32 = lVar32 + lVar20 * -8;
                    } while (iVar14 != iVar13);
                  }
                  if (0 < iVar15) {
                    iVar13 = 0;
                    do {
                      if (0 < (int)uVar10) {
                        lVar24 = 0;
                        do {
                          pMVar19->data = (void *)puVar29[lVar28 + lVar24];
                          pMVar19 = (Mat *)&pMVar19->refcount;
                          lVar24 = lVar24 + -1;
                        } while (-lVar24 != uVar12);
                      }
                      if (0 < iVar11) {
                        lVar24 = 0;
                        lVar31 = 0;
                        do {
                          (&pMVar19->data)[lVar31] = (void *)puVar29[lVar31];
                          lVar31 = lVar31 + 1;
                          lVar24 = lVar24 + -8;
                        } while (iVar11 != (int)lVar31);
                        pMVar19 = (Mat *)((long)pMVar19 - lVar24);
                        puVar29 = (undefined8 *)((long)puVar29 - lVar24);
                      }
                      if (0 < (int)uVar3) {
                        lVar24 = 0;
                        do {
                          pMVar19->data = (void *)puVar29[lVar24 + -2];
                          pMVar19 = (Mat *)&pMVar19->refcount;
                          lVar24 = lVar24 + -1;
                        } while (-lVar24 != uVar33);
                      }
                      iVar13 = iVar13 + 1;
                    } while (iVar13 != iVar15);
                  }
                  if (0 < iVar1) {
                    puVar23 = puVar29 + -(long)(iVar11 * 2);
                    puVar29 = puVar29 + (lVar28 - iVar11 * 2);
                    iVar15 = 0;
                    do {
                      if (0 < (int)uVar10) {
                        lVar24 = 0;
                        do {
                          pMVar19->data = (void *)puVar29[lVar24];
                          pMVar19 = (Mat *)&pMVar19->refcount;
                          lVar24 = lVar24 + -1;
                        } while (-lVar24 != uVar12);
                      }
                      puVar27 = puVar23;
                      if (0 < iVar11) {
                        lVar28 = 0;
                        lVar24 = 0;
                        do {
                          (&pMVar19->data)[lVar24] = (void *)puVar23[lVar24];
                          lVar24 = lVar24 + 1;
                          lVar28 = lVar28 + -8;
                        } while (iVar11 != (int)lVar24);
                        pMVar19 = (Mat *)((long)pMVar19 - lVar28);
                        puVar27 = (undefined8 *)((long)puVar23 - lVar28);
                      }
                      if (0 < (int)uVar3) {
                        lVar24 = 0;
                        do {
                          pMVar19->data = (void *)puVar27[lVar24 + -2];
                          pMVar19 = (Mat *)&pMVar19->refcount;
                          lVar24 = lVar24 + -1;
                        } while (-lVar24 != uVar33);
                      }
                      puVar23 = puVar23 + -lVar20;
                      iVar15 = iVar15 + 1;
                      puVar29 = puVar29 + -lVar20;
                    } while (iVar15 != iVar1);
                  }
                }
              }
              uVar34 = uVar34 + 1;
              uVar26 = uVar26 + 1;
            } while (uVar34 != uVar16);
            return 0;
          }
          return -100;
        }
      }
      break;
    case 4:
      p_Var6 = this->_vptr_Padding_x86_fma[-3];
      if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0) {
        uVar16 = *(int *)(&this->field_0xe8 + (long)p_Var6) + iVar11 +
                 *(int *)(&this->field_0xec + (long)p_Var6);
        Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var6) +
                             *(int *)(&this->field_0xdc + (long)p_Var6),
                    m.h + *(int *)(&this->field_0xd0 + (long)p_Var6) +
                    *(int *)(&this->field_0xd4 + (long)p_Var6),uVar16,uVar18,m.elemsize,8,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          if ((int)uVar18 < 1) {
            return 0;
          }
          uVar34 = 0;
          auVar55 = ZEXT3264(_DAT_00515cc0);
          auVar38 = vpcmpeqd_avx(auVar38,auVar38);
          auVar56 = ZEXT1664(auVar38);
          do {
            if (0 < (int)uVar16) {
              uVar12 = (ulong)*(float *)(&this->field_0xe4 + (long)this->_vptr_Padding_x86_fma[-3]);
              uVar12 = uVar12 << 0x38 | uVar12 << 0x30 | uVar12 << 0x28 |
                       uVar12 << 0x20 | uVar12 << 0x18 | uVar12 << 0x10 | uVar12 << 8 | uVar12;
              auVar38._8_8_ = 0;
              auVar38._0_8_ = uVar12;
              auVar38 = vpshufd_avx(auVar38,0x44);
              auVar57._16_16_ = auVar38;
              auVar57._0_16_ = auVar38;
              uVar33 = 0;
              do {
                pMVar19 = (Mat *)(long)top_blob->w;
                iVar22 = top_blob->h;
                pvVar7 = top_blob->data;
                sVar8 = top_blob->elemsize;
                lVar24 = top_blob->cstep * uVar34;
                lVar20 = (long)iVar22 * (long)pMVar19;
                p_Var6 = this->_vptr_Padding_x86_fma[-3];
                uVar26 = (int)uVar33 - *(int *)(&this->field_0xe8 + (long)p_Var6);
                auVar38 = auVar56._0_16_;
                if ((int)uVar26 < 0 || iVar11 <= (int)uVar26) {
                  uVar26 = (uint)lVar20;
                  if (0 < (int)uVar26) {
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = (ulong)(uVar26 & 0x7fffffff) - 1;
                    auVar39 = vpshufd_avx(auVar39,0x44);
                    auVar40._0_8_ = auVar39._0_8_ ^ 0x8000000000000000;
                    auVar40._8_4_ = auVar39._8_4_;
                    auVar40._12_4_ = auVar39._12_4_ ^ 0x80000000;
                    auVar43._0_8_ = auVar39._0_8_ ^ 0x8000000000000000;
                    auVar43._8_4_ = auVar40._8_4_;
                    auVar43._12_4_ = auVar39._12_4_ ^ 0x80000000;
                    uVar17 = 0;
                    do {
                      auVar45._8_8_ = 0;
                      auVar45._0_8_ = uVar17;
                      auVar39 = vpshufd_avx(auVar45,0x44);
                      auVar47._16_16_ = auVar39;
                      auVar47._0_16_ = auVar39;
                      auVar47 = vorps_avx(auVar47,auVar55._0_32_);
                      auVar51._0_8_ = auVar47._16_8_ ^ 0x8000000000000000;
                      auVar51._8_4_ = auVar47._24_4_;
                      auVar51._12_4_ = auVar47._28_4_ ^ 0x80000000;
                      auVar39 = vpcmpgtq_avx(auVar51,auVar40);
                      auVar46._0_8_ = auVar47._0_8_ ^ 0x8000000000000000;
                      auVar46._8_4_ = auVar47._8_4_;
                      auVar46._12_4_ = auVar47._12_4_ ^ 0x80000000;
                      auVar45 = vpcmpgtq_avx(auVar46,auVar43);
                      auVar48._16_16_ = auVar39 ^ auVar38;
                      auVar48._0_16_ = auVar45 ^ auVar38;
                      auVar47 = vmaskmovpd_avx(auVar48,auVar57);
                      *(undefined1 (*) [32])
                       ((long)pvVar7 +
                       uVar17 * 8 + sVar8 * ((long)iVar22 * uVar33 * (long)pMVar19 + lVar24)) =
                           auVar47;
                      uVar17 = uVar17 + 4;
                    } while ((uVar26 + 3 & 0xfffffffc) != uVar17);
                  }
                }
                else {
                  m.w = bottom_blob->w;
                  m.elemsize = bottom_blob->elemsize;
                  m.h = bottom_blob->h;
                  m.cstep = (long)m.h * (long)m.w;
                  m.elempack = bottom_blob->elempack;
                  m.data = (void *)((long)bottom_blob->data +
                                   m.cstep * m.elemsize * (ulong)uVar26 +
                                   bottom_blob->cstep * uVar34 * m.elemsize);
                  m.allocator = bottom_blob->allocator;
                  m.refcount = (int *)0x0;
                  m.dims = 2;
                  m.d = 1;
                  m.c = 1;
                  padding_constant_pack8_int8_sse
                            ((ncnn *)&m,
                             (Mat *)((long)pvVar7 + lVar20 * sVar8 * uVar33 + lVar24 * sVar8),
                             pMVar19,*(int *)(&this->field_0xd0 + (long)p_Var6),
                             *(int *)(&this->field_0xd4 + (long)p_Var6),
                             *(int *)(&this->field_0xd8 + (long)p_Var6),
                             *(int *)(&this->field_0xdc + (long)p_Var6),uVar12);
                  auVar38 = vpcmpeqd_avx(auVar38,auVar38);
                  auVar56 = ZEXT1664(auVar38);
                  auVar55 = ZEXT3264(_DAT_00515cc0);
                }
                uVar33 = uVar33 + 1;
              } while (uVar33 != uVar16);
            }
            uVar34 = uVar34 + 1;
          } while (uVar34 != uVar18);
          return 0;
        }
        return -100;
      }
    }
  }
  piVar9 = bottom_blob->refcount;
  m.data = bottom_blob->data;
  m.refcount = bottom_blob->refcount;
  m.allocator = bottom_blob->allocator;
  m.cstep = bottom_blob->cstep;
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + 1;
    UNLOCK();
  }
  if (m.elempack != 1) {
    opt_pack1.lightmode = opt->lightmode;
    opt_pack1._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_pack1.num_threads = opt->num_threads;
    opt_pack1.workspace_allocator = opt->workspace_allocator;
    opt_pack1.openmp_blocktime = opt->openmp_blocktime;
    opt_pack1.use_winograd_convolution = opt->use_winograd_convolution;
    opt_pack1.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_pack1.use_int8_inference = opt->use_int8_inference;
    opt_pack1.use_vulkan_compute = opt->use_vulkan_compute;
    opt_pack1.use_bf16_storage = opt->use_bf16_storage;
    opt_pack1.use_fp16_packed = opt->use_fp16_packed;
    opt_pack1.use_fp16_storage = opt->use_fp16_storage;
    opt_pack1.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_pack1.use_int8_packed = opt->use_int8_packed;
    opt_pack1.use_int8_storage = opt->use_int8_storage;
    opt_pack1.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_pack1.use_packing_layout = opt->use_packing_layout;
    opt_pack1.use_shader_pack8 = opt->use_shader_pack8;
    opt_pack1.use_subgroup_basic = opt->use_subgroup_basic;
    opt_pack1.use_subgroup_vote = opt->use_subgroup_vote;
    opt_pack1.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_pack1.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_pack1.use_image_storage = opt->use_image_storage;
    opt_pack1.use_tensor_storage = opt->use_tensor_storage;
    opt_pack1.use_reserved_0 = opt->use_reserved_0;
    opt_pack1.flush_denormals = opt->flush_denormals;
    opt_pack1.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_pack1.use_shader_local_memory = opt->use_shader_local_memory;
    opt_pack1.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_pack1.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_pack1.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_pack1.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_pack1.use_reserved_6 = opt->use_reserved_6;
    opt_pack1.use_reserved_7 = opt->use_reserved_7;
    opt_pack1.use_reserved_8 = opt->use_reserved_8;
    opt_pack1.use_reserved_9 = opt->use_reserved_9;
    opt_pack1.use_reserved_10 = opt->use_reserved_10;
    opt_pack1.use_reserved_11 = opt->use_reserved_11;
    opt_pack1.blob_allocator = opt->workspace_allocator;
    convert_packing(bottom_blob,&m,1,&opt_pack1);
  }
  iVar11 = Padding::forward((Padding *)
                            ((long)&this->_vptr_Padding_x86_fma +
                            (long)this->_vptr_Padding_x86_fma[-3]),&m,top_blob,opt);
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + -1;
    UNLOCK();
    if (*m.refcount == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar11;
}

Assistant:

int Padding_x86_fma::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}